

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkPairDetector.cpp
# Opt level: O2

cbtScalar cbtVec3PointSegmentDist2(cbtVector3 *P,cbtVector3 *x0,cbtVector3 *b,cbtVector3 *witness)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  cbtScalar cVar5;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar6 [16];
  undefined1 auVar9 [64];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined8 uVar15;
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar17 [16];
  cbtVector3 cVar18;
  cbtVector3 cVar19;
  float local_98;
  float local_88;
  float local_78;
  float local_48;
  float local_38;
  
  auVar16 = in_ZMM1._8_56_;
  auVar10 = in_ZMM0._8_56_;
  cVar18 = operator-(b,x0);
  auVar13._0_8_ = cVar18.m_floats._8_8_;
  auVar13._8_56_ = auVar16;
  auVar8._0_8_ = cVar18.m_floats._0_8_;
  auVar8._8_56_ = auVar10;
  auVar6 = auVar8._0_16_;
  auVar17 = vmovshdup_avx(auVar6);
  auVar10 = ZEXT856(auVar17._8_8_);
  auVar12 = auVar13._0_16_;
  cVar19 = operator-(x0,P);
  auVar14._0_8_ = cVar19.m_floats._8_8_;
  auVar14._8_56_ = auVar16;
  auVar9._0_8_ = cVar19.m_floats._0_8_;
  auVar9._8_56_ = auVar10;
  local_78 = auVar17._0_4_;
  auVar17 = vmovshdup_avx(auVar9._0_16_);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_78 * auVar17._0_4_)),auVar9._0_16_,auVar6);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_78 * local_78)),auVar6,auVar6);
  auVar7 = vfmadd231ss_fma(auVar7,auVar14._0_16_,auVar12);
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar7,auVar3);
  auVar7 = vfmadd231ss_fma(auVar4,auVar12,auVar12);
  auVar7._0_4_ = auVar3._0_4_ / auVar7._0_4_;
  auVar7._4_12_ = auVar3._4_12_;
  if ((auVar7._0_4_ < 0.0) ||
     (auVar4._8_4_ = 0x7fffffff, auVar4._0_8_ = 0x7fffffff7fffffff, auVar4._12_4_ = 0x7fffffff,
     auVar4 = vandps_avx512vl(auVar7,auVar4), auVar4._0_4_ < 1.1920929e-07)) {
    cVar5 = ccdVec3Dist2(x0,P);
    if (witness == (cbtVector3 *)0x0) {
      return cVar5;
    }
    uVar11 = *(undefined8 *)x0->m_floats;
    uVar15 = *(undefined8 *)(x0->m_floats + 2);
  }
  else {
    if (auVar7._0_4_ <= 1.0) {
      iVar2 = ccdEq(auVar7._0_4_,1.0);
      local_48 = cVar19.m_floats[0];
      local_38 = cVar19.m_floats[2];
      if (iVar2 == 0) {
        if (witness == (cbtVector3 *)0x0) {
          local_98 = cVar18.m_floats[0];
          local_88 = cVar18.m_floats[2];
          fVar1 = auVar17._0_4_ + auVar7._0_4_ * local_78;
          auVar17 = ZEXT416((uint)(local_48 + auVar7._0_4_ * local_98));
          auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar17,auVar17);
          auVar7 = ZEXT416((uint)(local_38 + auVar7._0_4_ * local_88));
          auVar17 = vfmadd231ss_fma(auVar17,auVar7,auVar7);
          return auVar17._0_4_;
        }
        auVar17 = vunpcklpd_avx(auVar6,auVar12);
        *(undefined1 (*) [16])witness->m_floats = auVar17;
        cbtVec3Scale(witness,auVar7._0_4_);
        ccdVec3Add(witness,x0);
        cVar5 = ccdVec3Dist2(witness,P);
        return cVar5;
      }
    }
    cVar5 = ccdVec3Dist2(b,P);
    if (witness == (cbtVector3 *)0x0) {
      return cVar5;
    }
    uVar11 = *(undefined8 *)b->m_floats;
    uVar15 = *(undefined8 *)(b->m_floats + 2);
  }
  *(undefined8 *)witness->m_floats = uVar11;
  *(undefined8 *)(witness->m_floats + 2) = uVar15;
  return cVar5;
}

Assistant:

inline cbtScalar cbtVec3PointSegmentDist2(const cbtVector3 *P,
										const cbtVector3 *x0,
										const cbtVector3 *b,
										cbtVector3 *witness)
{
	// The computation comes from solving equation of segment:
	//      S(t) = x0 + t.d
	//          where - x0 is initial point of segment
	//                - d is direction of segment from x0 (|d| > 0)
	//                - t belongs to <0, 1> interval
	//
	// Than, distance from a segment to some point P can be expressed:
	//      D(t) = |x0 + t.d - P|^2
	//          which is distance from any point on segment. Minimization
	//          of this function brings distance from P to segment.
	// Minimization of D(t) leads to simple quadratic equation that's
	// solving is straightforward.
	//
	// Bonus of this method is witness point for free.

	cbtScalar dist, t;
	cbtVector3 d, a;

	// direction of segment
	cbtVec3Sub2(&d, b, x0);

	// precompute vector from P to x0
	cbtVec3Sub2(&a, x0, P);

	t = -cbtScalar(1.) * cbtVec3Dot(&a, &d);
	t /= cbtVec3Dot(&d, &d);

	if (t < cbtScalar(0) || cbtFuzzyZero(t))
	{
		dist = ccdVec3Dist2(x0, P);
		if (witness)
			cbtVec3Copy(witness, x0);
	}
	else if (t > cbtScalar(1) || ccdEq(t, cbtScalar(1)))
	{
		dist = ccdVec3Dist2(b, P);
		if (witness)
			cbtVec3Copy(witness, b);
	}
	else
	{
		if (witness)
		{
			cbtVec3Copy(witness, &d);
			cbtVec3Scale(witness, t);
			ccdVec3Add(witness, x0);
			dist = ccdVec3Dist2(witness, P);
		}
		else
		{
			// recycling variables
			cbtVec3Scale(&d, t);
			ccdVec3Add(&d, &a);
			dist = cbtVec3Dot(&d, &d);
		}
	}

	return dist;
}